

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *ip;
  int iVar1;
  int threadNum;
  int maxTask;
  int blockTime;
  ostream *poVar2;
  WebServer webServer;
  
  if (argc < 7) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage:");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2,
                             " ip_address port_number thread_number maxTask_number waitTime flag_run_in_backstage(1"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 1;
  }
  else {
    if (*argv[6] == '1') {
      daemonize();
    }
    ip = argv[1];
    iVar1 = atoi(argv[2]);
    threadNum = atoi(argv[3]);
    maxTask = atoi(argv[4]);
    blockTime = atoi(argv[5]);
    WebServer::WebServer(&webServer,ip,iVar1,threadNum,maxTask,blockTime);
    WebServer::run(&webServer);
    poVar2 = std::operator<<((ostream *)&std::cout,"WebServer over!");
    std::endl<char,std::char_traits<char>>(poVar2);
    WebServer::~WebServer(&webServer);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    // test();

    if (argc < 7)
    {
        std::cout << "usage:" << argv[0] << " ip_address port_number thread_number maxTask_number waitTime flag_run_in_backstage(1\0)" << std::endl;
        return 1;
    }

    if (argv[6][0] == '1')
    {
        daemonize();
    }
    char *ip = argv[1];
    int port = atoi(argv[2]), threadNum = atoi(argv[3]), maxTask = atoi(argv[4]), blockTime = atoi(argv[5]);
    WebServer webServer(ip, port, threadNum, maxTask, blockTime);
    webServer.run();
    std::cout << "WebServer over!" << std::endl;
    return 0;
}